

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

int Aig_ManCoCleanup(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj;
  int i;
  int iVar2;
  
  iVar1 = p->nObjs[3];
  iVar2 = 0;
  for (i = 0; p_00 = p->vCos, i < p_00->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    if (((i < p->nObjs[3] - p->nRegs) &&
        ((*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x18) & 7) == 1)) &&
       (((ulong)pObj->pFanin0 & 1) != 0)) {
      Aig_ObjDisconnect(p,pObj);
      Vec_PtrWriteEntry(p->vObjs,pObj->Id,(void *)0x0);
    }
    else {
      Vec_PtrWriteEntry(p->vCos,iVar2,pObj);
      iVar2 = iVar2 + 1;
    }
  }
  Vec_PtrShrink(p_00,iVar2);
  iVar2 = p->vCos->nSize;
  p->nObjs[3] = iVar2;
  if (p->nRegs != 0) {
    p->nTruePos = iVar2 - p->nRegs;
  }
  return iVar1 - iVar2;
}

Assistant:

int Aig_ManCoCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPosOld = Aig_ManCoNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCos, pObj, i )
    {
        if ( i >= Aig_ManCoNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) || !Aig_ObjFaninC0(pObj) ) // non-const or const1
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else
        {
            Aig_ObjDisconnect( p, pObj );
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        }
    }
    Vec_PtrShrink( p->vCos, k );
    p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
    if ( Aig_ManRegNum(p) )
        p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    return nPosOld - Aig_ManCoNum(p);
}